

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O3

int metacall_function_return_type(void *func,metacall_value_id *id)

{
  metacall_value_id mVar1;
  signature s;
  type t;
  
  if (func == (void *)0x0) {
    mVar1 = METACALL_INVALID;
  }
  else {
    s = function_signature((function_conflict)func);
    t = signature_get_return(s);
    mVar1 = type_index(t);
  }
  *id = mVar1;
  return (uint)(func == (void *)0x0);
}

Assistant:

int metacall_function_return_type(void *func, enum metacall_value_id *id)
{
	if (func != NULL)
	{
		function f = (function)func;
		signature s = function_signature(f);

		*id = type_index(signature_get_return(s));

		return 0;
	}

	*id = METACALL_INVALID;

	return 1;
}